

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char *args_2,
          int *args_3,char *args_4,char (*args_5) [24],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
          char (*args_7) [2])

{
  ostringstream *in_RCX;
  Exception *in_RDX;
  char (*unaff_RBX) [24];
  ostream *in_RSI;
  char *in_RDI;
  char *in_R8;
  int *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char (*in_stack_00000008) [2];
  int *in_stack_ffffffffffffffb8;
  char *args_3_00;
  
  args_3_00 = in_RDI;
  std::operator<<(in_RSI,*(char **)in_RDX);
  SetWhat<char,int&,char,int&,char,char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
            (in_RDX,in_RCX,in_R8,in_R9,in_RDI,in_stack_ffffffffffffffb8,args_3_00,unaff_RBX,
             unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }